

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void build_directional_and_filter_intra_predictors
               (uint8_t *ref,int ref_stride,uint8_t *dst,int dst_stride,PREDICTION_MODE mode,
               int p_angle,FILTER_INTRA_MODE filter_intra_mode,TX_SIZE tx_size,
               int disable_edge_filter,int n_top_px,int n_topright_px,int n_left_px,
               int n_bottomleft_px,int intra_edge_filter_type)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int n_px_3;
  int n_px_2;
  int n_px_1;
  int strength_1;
  int n_px;
  int strength;
  int ab_le;
  int need_bottom;
  int need_right;
  int upsample_left;
  int upsample_above;
  int num_top_pixels_needed;
  int num_left_pixels_needed;
  int val;
  int use_filter_intra;
  int is_dr_mode;
  int need_above_left;
  int need_above;
  int need_left;
  int txhpx;
  int txwpx;
  uint8_t *left_col;
  uint8_t *above_row;
  uint8_t above_data [160];
  uint8_t left_data [160];
  uint8_t *left_ref;
  uint8_t *above_ref;
  int i;
  int local_214;
  int local_20c;
  int local_204;
  int local_1fc;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint local_1e0;
  undefined4 in_stack_fffffffffffffe24;
  TX_SIZE tx_size_00;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  undefined1 local_178 [15];
  byte local_169;
  byte abStack_168 [144];
  undefined1 local_d8 [15];
  byte local_c9;
  byte abStack_c8 [144];
  byte *local_38;
  byte *local_30;
  int local_28;
  int local_24;
  int local_1c;
  uint8_t *local_18;
  int local_c;
  
  tx_size_00 = (TX_SIZE)((uint)in_stack_fffffffffffffe24 >> 0x18);
  local_30 = (byte *)(in_RDI - in_ESI);
  local_38 = (byte *)(in_RDI + -1);
  local_214 = tx_size_wide[in_stack_00000010];
  iVar7 = tx_size_high[in_stack_00000010];
  bVar3 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 2;
  bVar4 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 4;
  bVar5 = "\x06\x04\x02\f\x16\x16\x16\"\f\x06\x06\x06\x16"[in_R8B] & 0x10;
  local_24 = in_R9D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  iVar6 = av1_is_directional_mode(in_R8B);
  memset(local_d8,0x81,0xa0);
  memset(local_178,0x7f,0xa0);
  if (iVar6 != 0) {
    bVar3 = 0x5a < local_24;
    bVar4 = local_24 < 0xb4;
    bVar5 = 1;
  }
  if (in_stack_00000008 != 5) {
    bVar5 = 1;
    bVar4 = 1;
    bVar3 = 1;
  }
  if (((bVar4 == 0) && (in_stack_00000030 == 0)) || ((bVar3 == 0 && (in_stack_00000020 == 0)))) {
    if (bVar3 == 0) {
      if (in_stack_00000030 < 1) {
        local_1e0 = 0x7f;
      }
      else {
        local_1e0 = (uint)*local_38;
      }
    }
    else if (in_stack_00000020 < 1) {
      local_1e0 = 0x81;
    }
    else {
      local_1e0 = (uint)*local_30;
    }
    for (local_28 = 0; local_28 < iVar7; local_28 = local_28 + 1) {
      memset(local_18,local_1e0 & 0xff,(long)local_214);
      local_18 = local_18 + local_1c;
    }
  }
  else {
    if (bVar3 != 0) {
      in_stack_fffffffffffffe14 = local_214;
      if (in_stack_00000038 < 0) {
        in_stack_fffffffffffffe14 = 0;
      }
      iVar6 = iVar7 + in_stack_fffffffffffffe14;
      local_28 = 0;
      in_stack_fffffffffffffe18 = iVar7;
      if (in_stack_00000030 < 1) {
        if (0 < in_stack_00000020) {
          memset(abStack_c8,(uint)*local_30,(long)iVar6);
        }
      }
      else {
        for (; local_28 < in_stack_00000030; local_28 = local_28 + 1) {
          abStack_c8[local_28] = local_38[local_28 * local_c];
        }
        if (0 < in_stack_00000038) {
          for (; local_28 < iVar7 + in_stack_00000038; local_28 = local_28 + 1) {
            abStack_c8[local_28] = local_38[local_28 * local_c];
          }
        }
        if (local_28 < iVar6) {
          memset(abStack_c8 + local_28,(uint)abStack_c8[local_28 + -1],(long)(iVar6 - local_28));
        }
      }
    }
    if (bVar4 != 0) {
      in_stack_fffffffffffffe0c = iVar7;
      if (in_stack_00000028 < 0) {
        in_stack_fffffffffffffe0c = 0;
      }
      in_stack_fffffffffffffe50 = local_214 + in_stack_fffffffffffffe0c;
      in_stack_fffffffffffffe10 = local_214;
      if (in_stack_00000020 < 1) {
        if (0 < in_stack_00000030) {
          memset(abStack_168,(uint)*local_38,(long)in_stack_fffffffffffffe50);
        }
      }
      else {
        memcpy(abStack_168,local_30,(long)in_stack_00000020);
        local_28 = in_stack_00000020;
        if (0 < in_stack_00000028) {
          memcpy(abStack_168 + local_214,local_30 + local_214,(long)in_stack_00000028);
          local_28 = in_stack_00000028 + local_28;
        }
        if (local_28 < in_stack_fffffffffffffe50) {
          memset(abStack_168 + local_28,(uint)abStack_168[local_28 + -1],
                 (long)(in_stack_fffffffffffffe50 - local_28));
        }
      }
    }
    if (bVar5 != 0) {
      if ((in_stack_00000020 < 1) || (in_stack_00000030 < 1)) {
        if (in_stack_00000020 < 1) {
          if (in_stack_00000030 < 1) {
            local_169 = 0x80;
          }
          else {
            local_169 = *local_38;
          }
        }
        else {
          local_169 = *local_30;
        }
      }
      else {
        local_169 = local_30[-1];
      }
      local_c9 = local_169;
    }
    if (in_stack_00000008 != 5) {
      (*av1_filter_intra_predictor)
                (local_18,(long)local_1c,in_stack_00000010,abStack_168,abStack_c8,in_stack_00000008)
      ;
    }
    else {
      if (in_stack_00000018 == 0) {
        bVar1 = 0x59 < local_24;
        bVar2 = local_24 < 0xb5;
        if ((local_24 != 0x5a) && (local_24 != 0xb4)) {
          if ((bVar4 != 0) && ((bVar3 != 0 && (0x17 < local_214 + iVar7)))) {
            filter_intra_edge_corner(abStack_168,abStack_c8);
          }
          if ((bVar4 != 0) && (0 < in_stack_00000020)) {
            iVar6 = intra_edge_filter_strength(local_214,iVar7,local_24 + -0x5a,in_stack_00000040);
            local_1fc = iVar7;
            if (bVar1) {
              local_1fc = 0;
            }
            in_stack_fffffffffffffe34 = in_stack_00000020 + 1 + local_1fc;
            (*av1_filter_intra_edge)(&local_169,in_stack_fffffffffffffe34,iVar6);
          }
          if ((bVar3 != 0) && (0 < in_stack_00000030)) {
            in_stack_fffffffffffffe30 =
                 intra_edge_filter_strength(iVar7,local_214,local_24 + -0xb4,in_stack_00000040);
            local_204 = local_214;
            if (bVar2) {
              local_204 = 0;
            }
            in_stack_fffffffffffffe2c = in_stack_00000030 + 1 + local_204;
            (*av1_filter_intra_edge)(&local_c9,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe30);
          }
        }
        iVar6 = av1_use_intra_edge_upsample(local_214,iVar7,local_24 + -0x5a,in_stack_00000040);
        if ((bVar4 != 0) && (iVar6 != 0)) {
          local_20c = iVar7;
          if (bVar1) {
            local_20c = 0;
          }
          in_stack_fffffffffffffe28 = local_214 + local_20c;
          (*av1_upsample_intra_edge)(abStack_168,in_stack_fffffffffffffe28);
        }
        iVar6 = av1_use_intra_edge_upsample(iVar7,local_214,local_24 + -0xb4,in_stack_00000040);
        if ((bVar3 != 0) && (iVar6 != 0)) {
          if (bVar2) {
            local_214 = 0;
          }
          iVar7 = iVar7 + local_214;
          (*av1_upsample_intra_edge)(abStack_c8,iVar7);
          tx_size_00 = (TX_SIZE)((uint)iVar7 >> 0x18);
        }
      }
      dr_predictor((uint8_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),tx_size_00,
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
    }
  }
  return;
}

Assistant:

static void build_directional_and_filter_intra_predictors(
    const uint8_t *ref, int ref_stride, uint8_t *dst, int dst_stride,
    PREDICTION_MODE mode, int p_angle, FILTER_INTRA_MODE filter_intra_mode,
    TX_SIZE tx_size, int disable_edge_filter, int n_top_px, int n_topright_px,
    int n_left_px, int n_bottomleft_px, int intra_edge_filter_type) {
  int i;
  const uint8_t *above_ref = ref - ref_stride;
  const uint8_t *left_ref = ref - 1;
  DECLARE_ALIGNED(16, uint8_t, left_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  DECLARE_ALIGNED(16, uint8_t, above_data[NUM_INTRA_NEIGHBOUR_PIXELS]);
  uint8_t *const above_row = above_data + 16;
  uint8_t *const left_col = left_data + 16;
  const int txwpx = tx_size_wide[tx_size];
  const int txhpx = tx_size_high[tx_size];
  int need_left = extend_modes[mode] & NEED_LEFT;
  int need_above = extend_modes[mode] & NEED_ABOVE;
  int need_above_left = extend_modes[mode] & NEED_ABOVELEFT;
  const int is_dr_mode = av1_is_directional_mode(mode);
  const int use_filter_intra = filter_intra_mode != FILTER_INTRA_MODES;
  assert(use_filter_intra || is_dr_mode);
  // The left_data, above_data buffers must be zeroed to fix some intermittent
  // valgrind errors. Uninitialized reads in intra pred modules (e.g. width = 4
  // path in av1_dr_prediction_z1_avx2()) from left_data, above_data are seen to
  // be the potential reason for this issue.
  memset(left_data, 129, NUM_INTRA_NEIGHBOUR_PIXELS);
  memset(above_data, 127, NUM_INTRA_NEIGHBOUR_PIXELS);

  // The default values if ref pixels are not available:
  // 128 127 127 .. 127 127 127 127 127 127
  // 129  A   B  ..  Y   Z
  // 129  C   D  ..  W   X
  // 129  E   F  ..  U   V
  // 129  G   H  ..  S   T   T   T   T   T
  // ..

  if (is_dr_mode) {
    if (p_angle <= 90)
      need_above = 1, need_left = 0, need_above_left = 1;
    else if (p_angle < 180)
      need_above = 1, need_left = 1, need_above_left = 1;
    else
      need_above = 0, need_left = 1, need_above_left = 1;
  }
  if (use_filter_intra) need_left = need_above = need_above_left = 1;

  assert(n_top_px >= 0);
  assert(n_topright_px >= -1);
  assert(n_left_px >= 0);
  assert(n_bottomleft_px >= -1);

  if ((!need_above && n_left_px == 0) || (!need_left && n_top_px == 0)) {
    int val;
    if (need_left) {
      val = (n_top_px > 0) ? above_ref[0] : 129;
    } else {
      val = (n_left_px > 0) ? left_ref[0] : 127;
    }
    for (i = 0; i < txhpx; ++i) {
      memset(dst, val, txwpx);
      dst += dst_stride;
    }
    return;
  }

  // NEED_LEFT
  if (need_left) {
    const int num_left_pixels_needed =
        txhpx + (n_bottomleft_px >= 0 ? txwpx : 0);
    i = 0;
    if (n_left_px > 0) {
      for (; i < n_left_px; i++) left_col[i] = left_ref[i * ref_stride];
      if (n_bottomleft_px > 0) {
        assert(i == txhpx);
        for (; i < txhpx + n_bottomleft_px; i++)
          left_col[i] = left_ref[i * ref_stride];
      }
      if (i < num_left_pixels_needed)
        memset(&left_col[i], left_col[i - 1], num_left_pixels_needed - i);
    } else if (n_top_px > 0) {
      memset(left_col, above_ref[0], num_left_pixels_needed);
    }
  }

  // NEED_ABOVE
  if (need_above) {
    const int num_top_pixels_needed = txwpx + (n_topright_px >= 0 ? txhpx : 0);
    if (n_top_px > 0) {
      memcpy(above_row, above_ref, n_top_px);
      i = n_top_px;
      if (n_topright_px > 0) {
        assert(n_top_px == txwpx);
        memcpy(above_row + txwpx, above_ref + txwpx, n_topright_px);
        i += n_topright_px;
      }
      if (i < num_top_pixels_needed)
        memset(&above_row[i], above_row[i - 1], num_top_pixels_needed - i);
    } else if (n_left_px > 0) {
      memset(above_row, left_ref[0], num_top_pixels_needed);
    }
  }

  if (need_above_left) {
    if (n_top_px > 0 && n_left_px > 0) {
      above_row[-1] = above_ref[-1];
    } else if (n_top_px > 0) {
      above_row[-1] = above_ref[0];
    } else if (n_left_px > 0) {
      above_row[-1] = left_ref[0];
    } else {
      above_row[-1] = 128;
    }
    left_col[-1] = above_row[-1];
  }

  if (use_filter_intra) {
    av1_filter_intra_predictor(dst, dst_stride, tx_size, above_row, left_col,
                               filter_intra_mode);
    return;
  }

  assert(is_dr_mode);
  int upsample_above = 0;
  int upsample_left = 0;
  if (!disable_edge_filter) {
    const int need_right = p_angle < 90;
    const int need_bottom = p_angle > 180;
    if (p_angle != 90 && p_angle != 180) {
      assert(need_above_left);
      const int ab_le = 1;
      if (need_above && need_left && (txwpx + txhpx >= 24)) {
        filter_intra_edge_corner(above_row, left_col);
      }
      if (need_above && n_top_px > 0) {
        const int strength = intra_edge_filter_strength(
            txwpx, txhpx, p_angle - 90, intra_edge_filter_type);
        const int n_px = n_top_px + ab_le + (need_right ? txhpx : 0);
        av1_filter_intra_edge(above_row - ab_le, n_px, strength);
      }
      if (need_left && n_left_px > 0) {
        const int strength = intra_edge_filter_strength(
            txhpx, txwpx, p_angle - 180, intra_edge_filter_type);
        const int n_px = n_left_px + ab_le + (need_bottom ? txwpx : 0);
        av1_filter_intra_edge(left_col - ab_le, n_px, strength);
      }
    }
    upsample_above = av1_use_intra_edge_upsample(txwpx, txhpx, p_angle - 90,
                                                 intra_edge_filter_type);
    if (need_above && upsample_above) {
      const int n_px = txwpx + (need_right ? txhpx : 0);
      av1_upsample_intra_edge(above_row, n_px);
    }
    upsample_left = av1_use_intra_edge_upsample(txhpx, txwpx, p_angle - 180,
                                                intra_edge_filter_type);
    if (need_left && upsample_left) {
      const int n_px = txhpx + (need_bottom ? txwpx : 0);
      av1_upsample_intra_edge(left_col, n_px);
    }
  }
  dr_predictor(dst, dst_stride, tx_size, above_row, left_col, upsample_above,
               upsample_left, p_angle);
}